

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

string * pystring::do_strip(string *__return_storage_ptr__,string *str,int striptype,string *chars)

{
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar1 = str->_M_string_length;
  iVar5 = (int)chars->_M_string_length;
  uVar8 = (uint)uVar1;
  uVar11 = uVar8;
  if (iVar5 == 0) {
    uVar13 = 0;
    if (0 < (int)uVar8 && striptype != 1) {
      pcVar2 = (str->_M_dataplus)._M_p;
      uVar13 = 0;
      do {
        iVar5 = ::isspace((int)pcVar2[uVar13]);
        if (iVar5 == 0) goto LAB_00107175;
        uVar13 = uVar13 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar13);
      uVar13 = uVar1 & 0xffffffff;
    }
LAB_00107175:
    uVar12 = (uint)uVar13;
    if (striptype != 0) {
      pcVar2 = (str->_M_dataplus)._M_p;
      lVar9 = (long)(int)uVar8;
      uVar6 = uVar8;
      if ((int)uVar12 < (int)uVar8) {
        uVar6 = uVar12;
      }
      uVar10 = uVar8 + 1;
      do {
        uVar11 = uVar6;
        if (lVar9 <= (int)uVar12) break;
        lVar4 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        iVar5 = ::isspace((int)pcVar2[lVar4]);
        uVar10 = uVar10 - 1;
        uVar11 = uVar10;
      } while (iVar5 != 0);
    }
  }
  else {
    pcVar2 = (chars->_M_dataplus)._M_p;
    uVar13 = 0;
    if (0 < (int)uVar8 && striptype != 1) {
      pcVar3 = (str->_M_dataplus)._M_p;
      uVar13 = 0;
      do {
        pvVar7 = memchr(pcVar2,(int)pcVar3[uVar13],(long)iVar5);
        if (pvVar7 == (void *)0x0) goto LAB_0010710b;
        uVar13 = uVar13 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar13);
      uVar13 = uVar1 & 0xffffffff;
    }
LAB_0010710b:
    uVar12 = (uint)uVar13;
    if (striptype != 0) {
      pcVar3 = (str->_M_dataplus)._M_p;
      lVar9 = (long)(int)uVar8;
      uVar6 = uVar8;
      if ((int)uVar12 < (int)uVar8) {
        uVar6 = uVar12;
      }
      uVar10 = uVar8 + 1;
      do {
        uVar11 = uVar6;
        if (lVar9 <= (int)uVar12) break;
        lVar4 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        pvVar7 = memchr(pcVar2,(int)pcVar3[lVar4],(long)iVar5);
        uVar10 = uVar10 - 1;
        uVar11 = uVar10;
      } while (pvVar7 != (void *)0x0);
    }
  }
  if ((uVar11 == uVar8) && (uVar12 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string do_strip( const std::string & str, int striptype, const std::string & chars  )
    {
        Py_ssize_t len = (Py_ssize_t) str.size(), i, j, charslen = (Py_ssize_t) chars.size();

        if ( charslen == 0 )
        {
            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && ::isspace( str[i] ) )
                {
                    i++;
                }
            }

            j = len;
            if ( striptype != LEFTSTRIP )
            {
                do
                {
                    j--;
                }
                while (j >= i && ::isspace(str[j]));

                j++;
            }


        }
        else
        {
            const char * sep = chars.c_str();

            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && memchr(sep, str[i], charslen) )
                {
                    i++;
                }
            }

            j = len;
            if (striptype != LEFTSTRIP)
            {
                do
                {
                    j--;
                }
                while (j >= i &&  memchr(sep, str[j], charslen)  );
                j++;
            }


        }

        if ( i == 0 && j == len )
        {
            return str;
        }
        else
        {
            return str.substr( i, j - i );
        }

    }